

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(void)

{
  long lVar1;
  date dates [3];
  uint auStack_50 [6];
  ulong local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  
  printf("Year: %i\n",0x7e4);
  printf("Month: %i\n",2);
  printf("Day: %i\n",0x19);
  local_38 = 0x1a00000003;
  uStack_30 = 0x4000007e2;
  auStack_50[2] = 0x7e4;
  auStack_50[3] = 2;
  auStack_50[4] = 0x19;
  auStack_50[5] = 0x7e4;
  local_28 = 0x13;
  lVar1 = 8;
  do {
    printf("%i-%i-%i\n",(ulong)*(uint *)((long)auStack_50 + lVar1),
           (ulong)*(uint *)((long)auStack_50 + lVar1 + 4),
           (ulong)*(uint *)((long)auStack_50 + lVar1 + 8));
    lVar1 = lVar1 + 0xc;
  } while (lVar1 != 0x2c);
  auStack_50[2] = 0x7df;
  auStack_50[3] = 5;
  auStack_50[4] = 0x19;
  printf("Year: %i\n",0x7df);
  printf("Month: %i\n",5);
  printf("Day: %i\n",0x19);
  printf("Year: %i\n",0x7df);
  printf("Month: %i\n",5);
  printf("Day: %i\n",0x19);
  printf("Year: %i\n",(ulong)auStack_50[5]);
  printf("Month: %i\n",local_38 & 0xffffffff);
  printf("Day: %i\n",local_38 >> 0x20);
  printf("%i-%i-%i %i:%i:%i\n",0x7e4,0xc,0x19,0xc,0,0);
  return 0;
}

Assistant:

int main() {

    struct date current_date = {2020, .month=2, 25};

    /*
    current_date.year = 2020;
    current_date.month = 2;
    current_date.day = 25;
    */

    printf("Year: %i\n", current_date.year);
    printf("Month: %i\n", current_date.month);
    printf("Day: %i\n", current_date.day);

    struct date dates[] = {
        {2020, 2, 25}, {2020, 3, 26}, {2018, 4, 19}
    };

    for (int i=0; i<sizeof(dates)/sizeof(struct date); i++) {
        printf("%i-%i-%i\n", dates[i].year, dates[i].month, dates[i].day);
    }

    struct date *ptr = dates;
    (*ptr).year = 2015;
    ptr->month = 5;
    ptr->day = 25;

    printf("Year: %i\n", dates[0].year);
    printf("Month: %i\n", dates[0].month);
    printf("Day: %i\n", dates[0].day);

    printf("Year: %i\n", ptr[0].year);
    printf("Month: %i\n", ptr[0].month);
    printf("Day: %i\n", ptr[0].day);

    ptr += 1;

    printf("Year: %i\n", ptr->year);
    printf("Month: %i\n", ptr->month);
    printf("Day: %i\n", ptr->day);

    struct datetime dt = {2020, 12, 25, 12, 00, 00};
    printf("%i-%i-%i %i:%i:%i\n",
            dt.d.year, dt.d.month, dt.d.day,
            dt.t.hour, dt.t.min, dt.t.sec);

    return 0;
}